

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O0

void sum_histograms(uint32_t kHistBuckets,uint32_t kHistSize,uint32_t *hist)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  uint32_t local_58 [4];
  uint32_t *offset_1;
  uint local_40;
  uint32_t bucket_1;
  uint32_t i;
  uint32_t tsum;
  uint32_t *offset;
  uint32_t bucket;
  unsigned_long __vla_expr0;
  uint32_t *hist_local;
  uint32_t kHistSize_local;
  uint32_t kHistBuckets_local;
  
  lVar3 = -0x58 - ((ulong)kHistBuckets * 4 + 0xf & 0xfffffffffffffff0);
  for (offset._4_4_ = 0; offset._4_4_ < kHistBuckets; offset._4_4_ = offset._4_4_ + 1) {
    *(uint32_t *)((long)local_58 + (ulong)offset._4_4_ * 4 + lVar3 + 0x58) =
         hist[offset._4_4_ * kHistSize];
    hist[offset._4_4_ * kHistSize] = 0;
  }
  for (local_40 = 1; local_40 < kHistSize; local_40 = local_40 + 1) {
    for (offset_1._4_4_ = 0; offset_1._4_4_ < kHistBuckets; offset_1._4_4_ = offset_1._4_4_ + 1) {
      uVar1 = hist[(ulong)(offset_1._4_4_ * kHistSize) + (ulong)local_40];
      iVar2 = *(int *)((long)local_58 + (ulong)offset_1._4_4_ * 4 + lVar3 + 0x58);
      hist[(ulong)(offset_1._4_4_ * kHistSize) + (ulong)local_40] =
           *(uint32_t *)((long)local_58 + (ulong)offset_1._4_4_ * 4 + lVar3 + 0x58);
      *(uint32_t *)((long)local_58 + (ulong)offset_1._4_4_ * 4 + lVar3 + 0x58) = uVar1 + iVar2;
    }
  }
  return;
}

Assistant:

static void sum_histograms(uint32_t kHistBuckets, uint32_t kHistSize, uint32_t* restrict hist)
{
    uint32_t sum[kHistBuckets];
    for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
    {
        uint32_t* restrict offset = hist + (bucket * kHistSize);
        sum[bucket] = offset[0];
        offset[0] = 0;
    }

    uint32_t tsum;
    for (uint32_t i = 1; i < kHistSize; ++i)
    {
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            uint32_t* restrict offset = hist + (bucket * kHistSize);
            tsum = offset[i] + sum[bucket];
            offset[i] = sum[bucket];
            sum[bucket] = tsum;
        }
    }
}